

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

void __thiscall
kj::ArrayBuilder<kj::Exception::Detail>::removeLast(ArrayBuilder<kj::Exception::Detail> *this)

{
  RemoveConst<kj::Exception::Detail> *pRVar1;
  uchar *puVar2;
  size_t sVar3;
  ArrayDisposer *pAVar4;
  
  pRVar1 = this->pos;
  this->pos = pRVar1 + -1;
  puVar2 = pRVar1[-1].value.ptr;
  if (puVar2 != (uchar *)0x0) {
    sVar3 = pRVar1[-1].value.size_;
    pRVar1[-1].value.ptr = (uchar *)0x0;
    pRVar1[-1].value.size_ = 0;
    pAVar4 = pRVar1[-1].value.disposer;
    (**pAVar4->_vptr_ArrayDisposer)(pAVar4,puVar2,1,sVar3,sVar3,0);
  }
  return;
}

Assistant:

void removeLast() {
    KJ_IREQUIRE(pos > ptr, "No elements present to remove.");
    kj::dtor(*--pos);
  }